

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::extMul<8ul,signed_char,short,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Type *other;
  Literal *val;
  long lVar1;
  Literal *this_00;
  undefined1 local_400 [8];
  LaneArray<8UL_*_2> lhs;
  LaneArray<8UL_*_2> rhs;
  LaneArray<8UL> result;
  
  getLanes<signed_char,16>((LaneArray<16> *)local_400,this,a);
  getLanes<signed_char,16>((LaneArray<16> *)&lhs._M_elems[0xf].type,(wasm *)a,val);
  lVar1 = 0;
  memset(&rhs._M_elems[0xf].type,0,0xc0);
  other = &result._M_elems[7].type;
  do {
    if ((*(long *)((long)&lhs._M_elems[0].field_0 + lVar1 + 8) != 2) ||
       (*(long *)((long)&rhs._M_elems[0].field_0 + lVar1 + 8) != 2)) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    result._M_elems[7].type.id._0_4_ =
         (int)*(char *)((long)rhs._M_elems + lVar1 + -8) * (int)(char)local_400[lVar1];
    this_00 = (Literal *)((long)result._M_elems + lVar1 + -8);
    if (this_00 != (Literal *)other) {
      Literal::~Literal(this_00);
      Literal::Literal(this_00,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)&rhs._M_elems[0xf].type);
  lVar1 = 0xa8;
  do {
    Literal::~Literal((Literal *)((long)result._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x168;
  do {
    Literal::~Literal((Literal *)((long)rhs._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x168;
  do {
    Literal::~Literal((Literal *)(local_400 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}